

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

void __thiscall calculator::Token::Token(Token *this,char c)

{
  long *plVar1;
  long lVar2;
  undefined1 local_2d3;
  undefined1 local_2d2;
  undefined1 local_2d1;
  undefined4 local_2d0 [2];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined4 local_2a8;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined4 local_280;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined4 local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined4 local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined4 local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined4 local_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined4 local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined4 local_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined4 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined4 local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  
  this->_vptr_Token = (_func_int **)&PTR__Token_00118510;
  local_2d0[0] = 3;
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"&","");
  local_2a8 = 4;
  local_2a0[0] = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"|","");
  local_280 = 5;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"!","");
  local_258 = 6;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"^","");
  local_230 = 7;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"~","");
  local_208 = 9;
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"+","");
  local_1e0 = 10;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"-","");
  local_1b8 = 0xb;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"*","");
  local_190 = 0xc;
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/","");
  local_168 = 8;
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"=","");
  local_140 = 0xd;
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"%","");
  local_118 = 0xe;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"<<","");
  local_f0 = 0xf;
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,">>","");
  local_c8 = 0x10;
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"**","");
  local_a0 = 0x13;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,";","");
  local_78 = 0x16;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"(","");
  local_50 = 0x17;
  plVar1 = local_38;
  local_48[0] = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,")","");
  std::
  _Hashtable<calculator::Tag,std::pair<calculator::Tag_const,std::__cxx11::string>,std::allocator<std::pair<calculator::Tag_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<calculator::Tag>,std::hash<calculator::Tag>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<calculator::Tag_const,std::__cxx11::string>const*>
            ((_Hashtable<calculator::Tag,std::pair<calculator::Tag_const,std::__cxx11::string>,std::allocator<std::pair<calculator::Tag_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<calculator::Tag>,std::hash<calculator::Tag>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->tagTable,local_2d0,&stack0xffffffffffffffd8,0,&local_2d1,&local_2d2,
             &local_2d3);
  lVar2 = -0x2a8;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  this->__tag = Other;
  this->__c = c;
  return;
}

Assistant:

Token(char c) : __tag(Tag::Other), __c(c) {}